

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_statics.cpp
# Opt level: O2

int ON_DBL::Compare(double *lhs,double *rhs)

{
  int iVar1;
  
  if (lhs == rhs) {
    return 0;
  }
  if (lhs == (double *)0x0) {
    iVar1 = 1;
  }
  else {
    if (rhs != (double *)0x0) {
      iVar1 = CompareValue(*lhs,*rhs);
      return iVar1;
    }
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

int ON_DBL::Compare(const double* lhs, const double* rhs)
{
  // sort nullptr to the end
  if (lhs == rhs)
    return 0;
  if (nullptr == lhs)
    return 1;
  if (nullptr == rhs)
    return -1;
  return ON_DBL::CompareValue(*lhs, *rhs);
}